

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O2

int getencoding(xmlattr_list *list)

{
  char *__s1;
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = 0;
  while (iVar3 = iVar1, list = (xmlattr_list *)((xmlattr *)list)->next,
        (xmlattr *)list != (xmlattr *)0x0) {
    iVar2 = strcmp(((xmlattr *)list)->name,"style");
    iVar1 = iVar3;
    if (iVar2 == 0) {
      __s1 = ((xmlattr *)list)->value;
      iVar2 = strcmp(__s1,"application/octet-stream");
      iVar1 = 0;
      if (iVar2 != 0) {
        iVar2 = strcmp(__s1,"application/x-gzip");
        iVar1 = 1;
        if (iVar2 != 0) {
          iVar2 = strcmp(__s1,"application/x-bzip2");
          iVar1 = 2;
          if (iVar2 != 0) {
            iVar2 = strcmp(__s1,"application/x-lzma");
            iVar1 = 3;
            if (iVar2 != 0) {
              iVar2 = strcmp(__s1,"application/x-xz");
              iVar1 = iVar3;
              if (iVar2 == 0) {
                iVar1 = 4;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int
getencoding(struct xmlattr_list *list)
{
	struct xmlattr *attr;
	enum enctype encoding = NONE;

	for (attr = list->first; attr != NULL; attr = attr->next) {
		if (strcmp(attr->name, "style") == 0) {
			if (strcmp(attr->value, "application/octet-stream") == 0)
				encoding = NONE;
			else if (strcmp(attr->value, "application/x-gzip") == 0)
				encoding = GZIP;
			else if (strcmp(attr->value, "application/x-bzip2") == 0)
				encoding = BZIP2;
			else if (strcmp(attr->value, "application/x-lzma") == 0)
				encoding = LZMA;
			else if (strcmp(attr->value, "application/x-xz") == 0)
				encoding = XZ;
		}
	}
	return (encoding);
}